

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,double,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,true,false>
               (interval_t *ldata,double *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int64_t *piVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  interval_t iVar10;
  interval_t iVar11;
  int64_t *local_68;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar10 = *ldata;
      local_68 = &result_data->micros;
      iVar7 = 0;
      do {
        iVar11 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                           (iVar10,rdata[iVar7]);
        ((interval_t *)(local_68 + -1))->months = (int)iVar11._0_8_;
        ((interval_t *)(local_68 + -1))->days = (int)((ulong)iVar11._0_8_ >> 0x20);
        *local_68 = iVar11.micros;
        iVar7 = iVar7 + 1;
        local_68 = local_68 + 2;
      } while (count != iVar7);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar8 = 0;
    uVar4 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
LAB_010b471b:
        uVar3 = uVar8;
        if (uVar8 < uVar9) {
          iVar10 = *ldata;
          piVar6 = &result_data[uVar8].micros;
          do {
            iVar11 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                               (iVar10,rdata[uVar8]);
            ((interval_t *)(piVar6 + -1))->months = (int)iVar11._0_8_;
            ((interval_t *)(piVar6 + -1))->days = (int)((ulong)iVar11._0_8_ >> 0x20);
            *piVar6 = iVar11.micros;
            uVar8 = uVar8 + 1;
            piVar6 = piVar6 + 2;
            uVar3 = uVar9;
          } while (uVar9 != uVar8);
        }
      }
      else {
        uVar2 = puVar1[uVar4];
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
        uVar3 = uVar9;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_010b471b;
          uVar3 = uVar8;
          if (uVar8 < uVar9) {
            piVar6 = &result_data[uVar8].micros;
            uVar5 = 0;
            do {
              if ((uVar2 >> (uVar5 & 0x3f) & 1) != 0) {
                iVar10 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                                   (*ldata,rdata[uVar8 + uVar5]);
                ((interval_t *)(piVar6 + -1))->months = (int)iVar10._0_8_;
                ((interval_t *)(piVar6 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
                *piVar6 = iVar10.micros;
              }
              uVar5 = uVar5 + 1;
              piVar6 = piVar6 + 2;
              uVar3 = uVar9;
            } while (uVar9 - uVar8 != uVar5);
          }
        }
      }
      uVar8 = uVar3;
      uVar4 = uVar4 + 1;
    } while (uVar4 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}